

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testutil.cc
# Opt level: O0

void RunManyThreadsWithId(_func_void_int *fn,int count)

{
  function<void_(int)> local_38;
  int local_14;
  _func_void_int *p_Stack_10;
  int count_local;
  _func_void_int *fn_local;
  
  local_14 = count;
  p_Stack_10 = fn;
  std::function<void(int)>::function<void(*&)(int),void>
            ((function<void(int)> *)&local_38,&stack0xfffffffffffffff0);
  RunMany(&local_38,local_14);
  std::function<void_(int)>::~function(&local_38);
  return;
}

Assistant:

void RunManyThreadsWithId(void (*fn)(int), int count) {
    RunMany(fn, count);
  }